

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O2

char * __thiscall cpptrace::nested_exception::message(nested_exception *this)

{
  long *plVar1;
  char *__rhs;
  undefined1 auVar2 [12];
  allocator<char> local_61;
  exception_ptr local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->message_value)._M_string_length == 0) {
    std::__exception_ptr::exception_ptr::exception_ptr(&local_60,&this->ptr);
    auVar2 = std::rethrow_exception((exception_ptr)&local_60);
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_60);
    plVar1 = (long *)__cxa_begin_catch(auVar2._0_8_);
    if (auVar2._8_4_ == 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Nested exception: ",&local_61);
      __rhs = (char *)(**(code **)(*plVar1 + 0x10))(plVar1);
      std::operator+(&local_38,&local_58,__rhs);
    }
    else {
      detail::exception_type_name_abi_cxx11_();
      std::operator+(&local_38,"Nested exception holding instance of ",&local_58);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->message_value,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    __cxa_end_catch();
  }
  return (this->message_value)._M_dataplus._M_p;
}

Assistant:

const char* nested_exception::message() const noexcept {
        if(message_value.empty()) {
            try {
                std::rethrow_exception(ptr);
            } catch(std::exception& e) {
                message_value = std::string("Nested exception: ") + e.what();
            } catch(...) {
                message_value = "Nested exception holding instance of " + detail::exception_type_name();
            }
        }
        return message_value.c_str();
    }